

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

AssertionResult
testing::internal::HasOneFailure
          (char *param_1,char *param_2,char *param_3,TestPartResultArray *results,Type type,
          string *substr)

{
  TestPartResultArray *this;
  TestPartResult *pTVar1;
  Message *pMVar2;
  AssertionResult *pAVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  char *pcVar4;
  undefined4 in_register_00000084;
  int i;
  int index;
  AssertionResult AVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  undefined1 local_60 [8];
  String expected;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  Message msg;
  
  this = (TestPartResultArray *)CONCAT44(in_register_00000084,type);
  pcVar4 = "1 non-fatal failure";
  if ((Type)substr == kFatalFailure) {
    pcVar4 = "1 fatal failure";
  }
  msg.ss_.ptr_ = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )param_1;
  String::String((String *)local_60,pcVar4);
  Message::Message((Message *)&local_40);
  if ((*(long *)(this + 8) - *(long *)this & 0x3fffffffc0U) == 0x40) {
    pTVar1 = TestPartResultArray::GetTestPartResult(this,0);
    if (pTVar1->type_ == (Type)substr) {
      pcVar4 = strstr((pTVar1->message_).c_str_,(in_stack_00000008->_M_dataplus)._M_p);
      if (pcVar4 != (char *)0x0) {
        *(undefined1 *)msg.ss_.ptr_ = 1;
        *(undefined8 *)((long)msg.ss_.ptr_ + 8) = 0;
        goto LAB_001243ac;
      }
      expected.length_._0_4_ = (uint)expected.length_ & 0xffffff00;
      local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)&expected.length_,(char (*) [11])0x137a67);
      pAVar3 = AssertionResult::operator<<(pAVar3,(String *)local_60);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [14])" containing \"");
      pAVar3 = AssertionResult::operator<<(pAVar3,in_stack_00000008);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [3])0x138266);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)msg.ss_.ptr_,pAVar3);
    }
    else {
      expected.length_._0_4_ = (uint)expected.length_ & 0xffffff00;
      local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      pAVar3 = AssertionResult::operator<<
                         ((AssertionResult *)&expected.length_,(char (*) [11])0x137a67);
      pAVar3 = AssertionResult::operator<<(pAVar3,(String *)local_60);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x1381b3);
      pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [11])"  Actual:\n");
      pAVar3 = AssertionResult::operator<<(pAVar3,pTVar1);
      AssertionResult::AssertionResult((AssertionResult *)msg.ss_.ptr_,pAVar3);
    }
  }
  else {
    pMVar2 = Message::operator<<((Message *)&local_40,(char (*) [11])0x137a67);
    pMVar2 = Message::operator<<(pMVar2,(String *)local_60);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x1381b3);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x137a5b);
    expected.length_._0_4_ = (uint)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
    pMVar2 = Message::operator<<(pMVar2,(int *)&expected.length_);
    Message::operator<<(pMVar2,(char (*) [10])" failures");
    for (index = 0; index < (int)((ulong)(*(long *)(this + 8) - *(long *)this) >> 6);
        index = index + 1) {
      pMVar2 = Message::operator<<((Message *)&local_40,(char (*) [2])0x1381b3);
      pTVar1 = TestPartResultArray::GetTestPartResult(this,index);
      Message::operator<<(pMVar2,pTVar1);
    }
    expected.length_._0_4_ = (uint)expected.length_ & 0xffffff00;
    local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    pAVar3 = AssertionResult::operator<<((AssertionResult *)&expected.length_,(Message *)&local_40);
    AssertionResult::AssertionResult((AssertionResult *)msg.ss_.ptr_,pAVar3);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_48);
LAB_001243ac:
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_40);
  String::~String((String *)local_60);
  AVar5.message_.ptr_ = extraout_RDX.ptr_;
  AVar5._0_8_ = msg.ss_.ptr_;
  return AVar5;
}

Assistant:

AssertionResult HasOneFailure(const char* /* results_expr */,
                              const char* /* type_expr */,
                              const char* /* substr_expr */,
                              const TestPartResultArray& results,
                              TestPartResult::Type type,
                              const string& substr) {
  const String expected(type == TestPartResult::kFatalFailure ?
                        "1 fatal failure" :
                        "1 non-fatal failure");
  Message msg;
  if (results.size() != 1) {
    msg << "Expected: " << expected << "\n"
        << "  Actual: " << results.size() << " failures";
    for (int i = 0; i < results.size(); i++) {
      msg << "\n" << results.GetTestPartResult(i);
    }
    return AssertionFailure() << msg;
  }

  const TestPartResult& r = results.GetTestPartResult(0);
  if (r.type() != type) {
    return AssertionFailure() << "Expected: " << expected << "\n"
                              << "  Actual:\n"
                              << r;
  }

  if (strstr(r.message(), substr.c_str()) == NULL) {
    return AssertionFailure() << "Expected: " << expected << " containing \""
                              << substr << "\"\n"
                              << "  Actual:\n"
                              << r;
  }

  return AssertionSuccess();
}